

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

bool __thiscall asl::SocketServer::bindPath(SocketServer *this,String *sname)

{
  AtomicCount *pAVar1;
  int iVar2;
  char *****b;
  LocalSocket server;
  SmartObject local_38;
  int local_30;
  int local_2c;
  char ****local_28 [2];
  
  LocalSocket::LocalSocket((LocalSocket *)&local_38);
  iVar2 = (*(local_38._p)->_vptr_SmartObject_[7])(local_38._p,sname);
  if (SUB41(iVar2,0) == false) {
    (*(local_38._p)->_vptr_SmartObject_[0x10])(&local_30);
    b = (char *****)local_28[0];
    if (local_30 == 0) {
      b = local_28;
    }
    String::assign(&this->_socketError,(char *)b,local_2c);
    if (local_30 != 0) {
      free(local_28[0]);
    }
  }
  else {
    (*(local_38._p)->_vptr_SmartObject_[8])(local_38._p,5);
    Sockets::operator<<(&this->_sockets,(Socket *)&local_38);
  }
  if (local_38._p != (SmartObject_ *)0x0) {
    LOCK();
    pAVar1 = &(local_38._p)->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && (local_38._p != (SmartObject_ *)0x0)) {
      (*(local_38._p)->_vptr_SmartObject_[1])();
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool SocketServer::bindPath(const String& sname)
{
#if !defined(_WIN32) || defined(ASL_SOCKET_LOCAL)
	LocalSocket server;
	if(server.bind(sname))
	{
		server.listen(5);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
#else
	(void)sname;
	_socketError = "SOCKET_BAD_BIND";
#endif
	return false;
}